

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.hpp
# Opt level: O0

void __thiscall OpenMD::ObjectRestraint::ObjectRestraint(ObjectRestraint *this)

{
  Restraint *in_RDI;
  
  Restraint::Restraint(in_RDI);
  in_RDI->_vptr_Restraint = (_func_int **)&PTR__ObjectRestraint_0050bf18;
  Vector3<double>::Vector3((Vector3<double> *)0x3781a3);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3781ba);
  Vector3<double>::Vector3((Vector3<double> *)0x3781cd);
  Vector3<double>::Vector3((Vector3<double> *)0x3781e0);
  return;
}

Assistant:

ObjectRestraint() : Restraint() {}